

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

void __thiscall
wasm::OptimizeInstructions::skipCast
          (OptimizeInstructions *this,Expression **input,Type requiredType)

{
  bool bVar1;
  uintptr_t uVar2;
  long lVar3;
  Expression *pEVar4;
  
  if ((((this->
        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
        ).super_Pass.runner)->options).trapsNeverHappen != true) {
    return;
  }
  pEVar4 = *input;
  do {
    if (pEVar4->_id == RefCastId) {
      lVar3 = 0x10;
      if (requiredType.id != 0) {
        uVar2 = *(uintptr_t *)(pEVar4 + 1);
        goto LAB_009e5792;
      }
    }
    else {
      if (pEVar4->_id != RefAsId) {
        return;
      }
      lVar3 = 0x18;
      if (requiredType.id != 0) {
        uVar2 = pEVar4[1].type.id;
LAB_009e5792:
        bVar1 = wasm::Type::isSubType((Type)*(uintptr_t *)(uVar2 + 8),requiredType);
        if (!bVar1) {
          return;
        }
      }
    }
    pEVar4 = *(Expression **)(&pEVar4->_id + lVar3);
    *input = pEVar4;
  } while( true );
}

Assistant:

void skipCast(Expression*& input, Type requiredType = Type::none) {
    // Traps-never-happen mode is a requirement for us to optimize here.
    if (!getPassOptions().trapsNeverHappen) {
      return;
    }
    while (1) {
      if (auto* as = input->dynCast<RefAs>()) {
        if (requiredType == Type::none ||
            Type::isSubType(as->value->type, requiredType)) {
          input = as->value;
          continue;
        }
      } else if (auto* cast = input->dynCast<RefCast>()) {
        if (requiredType == Type::none ||
            Type::isSubType(cast->ref->type, requiredType)) {
          input = cast->ref;
          continue;
        }
      }
      break;
    }
  }